

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_type_pattern(lysp_ctx *ctx,lysp_stmt *stmt,lysp_restr **patterns)

{
  lysp_ext_instance **exts;
  uint16_t *puVar1;
  ly_stmt stmt_00;
  lysp_restr *plVar2;
  lyd_node *plVar3;
  bool bVar4;
  int iVar5;
  LY_ERR LVar6;
  undefined8 *puVar7;
  size_t __n;
  char *pcVar8;
  char *pcVar9;
  uint32_t substmt_index;
  ly_ctx *plVar10;
  lysp_ext_instance *plVar11;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  lysp_restr *plVar12;
  
  LVar6 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
  plVar2 = *patterns;
  if (plVar2 == (lysp_restr *)0x0) {
    puVar7 = (undefined8 *)malloc(0x48);
    if (puVar7 != (undefined8 *)0x0) {
      *puVar7 = 1;
      goto LAB_00170c68;
    }
  }
  else {
    plVar11 = (lysp_ext_instance *)((long)&(plVar2[-1].exts)->name + 1);
    plVar2[-1].exts = plVar11;
    puVar7 = (undefined8 *)realloc(&plVar2[-1].exts,(long)plVar11 * 0x40 | 8);
    if (puVar7 != (undefined8 *)0x0) {
LAB_00170c68:
      *patterns = (lysp_restr *)(puVar7 + 1);
      bVar4 = true;
      LVar6 = LY_SUCCESS;
      goto LAB_00170cb7;
    }
    (*patterns)[-1].exts = (lysp_ext_instance *)((long)&(*patterns)[-1].exts[-1].exts + 7);
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar10 = (ly_ctx *)0x0;
  }
  else {
    plVar10 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  bVar4 = false;
  LVar6 = LY_EMEM;
  ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern");
LAB_00170cb7:
  if (bVar4) {
    plVar2 = *patterns;
    plVar11 = plVar2[-1].exts;
    plVar2[(long)((long)&plVar11[-1].exts + 7)].ref = (char *)0x0;
    (&plVar2[(long)((long)&plVar11[-1].exts + 7)].ref)[1] = (char *)0x0;
    plVar2[(long)((long)&plVar11[-1].exts + 7)].eapptag = (char *)0x0;
    (&plVar2[(long)((long)&plVar11[-1].exts + 7)].eapptag)[1] = (char *)0x0;
    puVar1 = &plVar2[(long)((long)&plVar11[-1].exts + 7)].arg.flags;
    *(undefined8 *)puVar1 = 0;
    *(undefined8 *)(puVar1 + 4) = 0;
    plVar2[(long)((long)&plVar11[-1].exts + 7)].arg.str = (char *)0x0;
    plVar2[(long)((long)&plVar11[-1].exts + 7)].arg.mod = (lysp_module *)0x0;
    pcVar9 = stmt->arg;
    __n = strlen(pcVar9);
    pcVar8 = (char *)malloc(__n + 2);
    if (pcVar8 == (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar6 = LY_EMEM;
      ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern");
    }
    else {
      memmove(pcVar8 + 1,pcVar9,__n);
      *pcVar8 = '\x06';
      pcVar8[__n + 1] = '\0';
      if (ctx == (lysp_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar6 = lydict_insert_zc(plVar10,pcVar8,
                               (char **)(plVar2 + (long)((long)&plVar11[-1].exts + 7)));
      if (LVar6 == LY_SUCCESS) {
        plVar12 = plVar2 + (long)plVar11;
        plVar12[-1].arg.mod =
             (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        stmt_01 = stmt->child;
        if (stmt_01 == (lysp_stmt *)0x0) {
          LVar6 = LY_SUCCESS;
        }
        else {
          exts = &plVar12[-1].exts;
          iVar5 = (int)plVar12;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0xf0000) {
              substmt_index = iVar5 - 0x18;
              if (((stmt_00 != LY_STMT_DESCRIPTION) &&
                  (substmt_index = iVar5 - 0x20, stmt_00 != LY_STMT_ERROR_APP_TAG)) &&
                 (substmt_index = iVar5 - 0x28, stmt_00 != LY_STMT_ERROR_MESSAGE)) {
LAB_00170f19:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar10 = (ly_ctx *)0x0;
                }
                else {
                  plVar10 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar9 = lyplg_ext_stmt2str(stmt_00);
                pcVar8 = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_00170f86:
                ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,pcVar8,pcVar9,"pattern");
                return LY_EVALID;
              }
LAB_00170e8d:
              LVar6 = lysp_stmt_text_field
                                (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
            }
            else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
              LVar6 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_PATTERN,0,exts);
            }
            else {
              if (stmt_00 != LY_STMT_MODIFIER) {
                substmt_index = iVar5 - 0x10;
                if (stmt_00 != LY_STMT_REFERENCE) goto LAB_00170f19;
                goto LAB_00170e8d;
              }
              plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar3[2].schema < 2) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar10 = (ly_ctx *)0x0;
                }
                else {
                  plVar10 = (ly_ctx *)**(undefined8 **)plVar3;
                }
                pcVar8 = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar9 = "modifier";
                goto LAB_00170f86;
              }
              LVar6 = lysp_stmt_type_pattern_modifier
                                (ctx,stmt_01,(char **)(plVar2 + (long)((long)&plVar11[-1].exts + 7))
                                 ,exts);
            }
            if (LVar6 != LY_SUCCESS) {
              return LVar6;
            }
            stmt_01 = stmt_01->next;
            LVar6 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
lysp_stmt_type_pattern(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_restr **patterns)
{
    char *buf;
    size_t arg_len;
    struct lysp_restr *restr;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);
    arg_len = strlen(stmt->arg);

    /* add special meaning first byte */
    buf = malloc(arg_len + 2);
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    memmove(buf + 1, stmt->arg, arg_len);
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[arg_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->dsc, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->ref, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->eapptag, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->emsg, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(lysp_stmt_type_pattern_modifier(ctx, child, &restr->arg.str, &restr->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "pattern");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}